

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

size_t __thiscall
OpenSSLWrapper::SslConnection::SslGetOutData(SslConnection *this,uint8_t *szBuffer,size_t nBufLen)

{
  runtime_error *this_00;
  size_t nRead;
  
  if (this->m_ssl != (SSL *)0x0) {
    *(byte *)&this->m_iWantState = (byte)this->m_iWantState & 0xfd;
    BIO_read_ex(this->m_rbio);
    return 0;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Not Initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t SslConnection::SslGetOutData(uint8_t* szBuffer, size_t nBufLen)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        m_iWantState &= ~2;
        size_t nRead = 0;
        const int iResult = BIO_read_ex(m_rbio, szBuffer, nBufLen, &nRead);
        if (iResult <= 0)
            return 0;
        return nRead;
    }